

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void callFinaliser(sqlite3 *db,int offset)

{
  VTable **p;
  VTable *pVTab;
  code *pcVar1;
  long lVar2;
  VTable **aVTrans;
  
  p = db->aVTrans;
  if (p != (VTable **)0x0) {
    db->aVTrans = (VTable **)0x0;
    if (0 < db->nVTrans) {
      lVar2 = 0;
      do {
        pVTab = p[lVar2];
        if ((pVTab->pVtab != (sqlite3_vtab *)0x0) &&
           (pcVar1 = *(code **)((long)&pVTab->pVtab->pModule->iVersion + (ulong)(uint)offset),
           pcVar1 != (code *)0x0)) {
          (*pcVar1)();
        }
        pVTab->iSavepoint = 0;
        sqlite3VtabUnlock(pVTab);
        lVar2 = lVar2 + 1;
      } while (lVar2 < db->nVTrans);
    }
    sqlite3DbFreeNN(db,p);
    db->nVTrans = 0;
  }
  return;
}

Assistant:

static void callFinaliser(sqlite3 *db, int offset){
  int i;
  if( db->aVTrans ){
    VTable **aVTrans = db->aVTrans;
    db->aVTrans = 0;
    for(i=0; i<db->nVTrans; i++){
      VTable *pVTab = aVTrans[i];
      sqlite3_vtab *p = pVTab->pVtab;
      if( p ){
        int (*x)(sqlite3_vtab *);
        x = *(int (**)(sqlite3_vtab *))((char *)p->pModule + offset);
        if( x ) x(p);
      }
      pVTab->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab);
    }
    sqlite3DbFree(db, aVTrans);
    db->nVTrans = 0;
  }
}